

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_evsa.cpp
# Opt level: O0

void __thiscall phoenix_evsa_t::evsa_body_t::_read(evsa_body_t *this)

{
  uint8_t uVar1;
  bool bVar2;
  vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>
  *this_00;
  evsa_entry_t *this_01;
  pointer this_02;
  kstream *this_03;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_04;
  pointer this_05;
  bool local_79;
  uint8_t local_4d;
  int local_4c;
  int i_1;
  unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>
  local_40 [3];
  pointer local_28;
  evsa_entry_t *_;
  int i;
  evsa_body_t *local_10;
  evsa_body_t *this_local;
  
  local_10 = this;
  this_00 = (vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>
             *)operator_new(0x18);
  memset(this_00,0,0x18);
  std::
  vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>
  ::vector(this_00);
  std::
  unique_ptr<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>,std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>>>,std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>,std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>,std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>,std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>>>,std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>,std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>>>>>
              *)&stack0xffffffffffffffe8,this_00);
  std::
  unique_ptr<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_>_>
  ::operator=(&this->m_entries,
              (unique_ptr<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_>_>
               *)&stack0xffffffffffffffe8);
  std::
  unique_ptr<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_>_>
                 *)&stack0xffffffffffffffe8);
  _._4_4_ = 0;
  do {
    this_01 = (evsa_entry_t *)operator_new(0x30);
    evsa_entry_t::evsa_entry_t(this_01,(this->super_kstruct).m__io,this,this->m__root);
    local_28 = this_01;
    this_02 = std::
              unique_ptr<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_>_>
              ::operator->(&this->m_entries);
    std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>
    ::unique_ptr<std::default_delete<phoenix_evsa_t::evsa_entry_t>,void>
              ((unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>
                *)local_40,local_28);
    std::
    vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>
    ::push_back(this_02,(value_type *)local_40);
    std::
    unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>::
    ~unique_ptr(local_40);
    _._4_4_ = _._4_4_ + 1;
    uVar1 = evsa_entry_t::entry_type(local_28);
    if (uVar1 == 0xed) {
LAB_0018f208:
      this_03 = kaitai::kstruct::_io(&this->super_kstruct);
      local_79 = kaitai::kstream::is_eof(this_03);
    }
    else {
      uVar1 = evsa_entry_t::entry_type(local_28);
      if (uVar1 == 0xee) goto LAB_0018f208;
      uVar1 = evsa_entry_t::entry_type(local_28);
      if (uVar1 == 0xef) goto LAB_0018f208;
      uVar1 = evsa_entry_t::entry_type(local_28);
      if (uVar1 == 0xe1) goto LAB_0018f208;
      uVar1 = evsa_entry_t::entry_type(local_28);
      if (uVar1 == 0xe2) goto LAB_0018f208;
      uVar1 = evsa_entry_t::entry_type(local_28);
      if (uVar1 == 0xe3) goto LAB_0018f208;
      uVar1 = evsa_entry_t::entry_type(local_28);
      local_79 = true;
      if (uVar1 == 0x83) goto LAB_0018f208;
    }
    if (((local_79 ^ 0xffU) & 1) == 0) {
      this_04 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)operator_new(0x18);
      memset(this_04,0,0x18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this_04);
      std::
      unique_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::
      unique_ptr<std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((unique_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)&stack0xffffffffffffffb8,this_04);
      std::
      unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator=(&this->m_free_space,
                  (unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)&stack0xffffffffffffffb8);
      std::
      unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~unique_ptr((unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)&stack0xffffffffffffffb8);
      local_4c = 0;
      while( true ) {
        bVar2 = kaitai::kstream::is_eof((this->super_kstruct).m__io);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        this_05 = std::
                  unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator->(&this->m_free_space);
        local_4d = kaitai::kstream::read_u1((this->super_kstruct).m__io);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(this_05,&local_4d);
        local_4c = local_4c + 1;
      }
      return;
    }
  } while( true );
}

Assistant:

void phoenix_evsa_t::evsa_body_t::_read() {
    m_entries = std::unique_ptr<std::vector<std::unique_ptr<evsa_entry_t>>>(new std::vector<std::unique_ptr<evsa_entry_t>>());
    {
        int i = 0;
        evsa_entry_t* _;
        do {
            _ = new evsa_entry_t(m__io, this, m__root);
            m_entries->push_back(std::move(std::unique_ptr<evsa_entry_t>(_)));
            i++;
        } while (!( (( ((_->entry_type() != 237) && (_->entry_type() != 238) && (_->entry_type() != 239) && (_->entry_type() != 225) && (_->entry_type() != 226) && (_->entry_type() != 227) && (_->entry_type() != 131)) ) || (_io()->is_eof())) ));
    }
    m_free_space = std::unique_ptr<std::vector<uint8_t>>(new std::vector<uint8_t>());
    {
        int i = 0;
        while (!m__io->is_eof()) {
            m_free_space->push_back(std::move(m__io->read_u1()));
            i++;
        }
    }
}